

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::NodeTranslator::compileAnnotationApplications
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          NodeTranslator *this,Reader annotations,StringPtr targetsFlagName)

{
  BrandedDecl *pBVar1;
  Resolver *pRVar2;
  undefined8 uVar3;
  ErrorReporter *pEVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Builder target;
  Reader source;
  Reader source_00;
  Reader type;
  Builder target_00;
  Reader type_00;
  ImplicitParams implicitMethodParams;
  undefined1 auVar11 [40];
  Builder target_01;
  Reader name_00;
  Reader name_01;
  Reader name_02;
  Reader name_03;
  StringPtr name_04;
  BrandScope **ppBVar12;
  RemoveConst<capnp::compiler::BrandScope_*> *ppBVar13;
  BrandScope **ppBVar14;
  ushort uVar15;
  ReaderFor<bool> RVar16;
  short sVar17;
  undefined4 uVar18;
  WirePointer *pWVar19;
  ulong uVar20;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar21;
  BrandScope *pBVar22;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  NodeTranslator *this_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 in_R8;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar27;
  long lVar28;
  uint uVar29;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar30;
  DebugExpression<bool> DVar31;
  DebugExpression<bool> _kjCondition;
  Vector<capnp::compiler::BrandScope_*> levels;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *result;
  Reader name;
  Builder scopes;
  Builder bindings;
  Builder annotationBuilder;
  Reader annotation;
  NullableValue<capnp::compiler::BrandedDecl> _decl2410;
  BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> builder;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  StructDataBitCount SVar35;
  int iVar36;
  WirePointer *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  undefined8 in_stack_fffffffffffffb50;
  undefined7 uVar37;
  undefined1 uStack_479;
  undefined4 uStack_474;
  Vector<capnp::compiler::BrandScope_*> local_468;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *local_448;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_440;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_438;
  BrandScope *local_430;
  StructReader local_428;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_3f8;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aStack_3f0;
  short *local_3e8;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  uint local_3d8;
  ushort uStack_3d4;
  undefined2 uStack_3d2;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined8 local_3c8;
  byte local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  Disposer *local_388;
  BrandScope *pBStack_380;
  undefined4 local_378 [12];
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_348;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aStack_340;
  short *local_338;
  uint local_330;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_320;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aStack_318;
  undefined8 *local_310;
  short *local_308;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_2f8;
  ulong local_2f0;
  short *local_2e8;
  short *local_2e0;
  uint local_2d8;
  ushort local_2d4;
  undefined4 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  size_t local_2b8;
  Reader *local_2b0;
  undefined4 *local_2a8;
  NodeTranslator *local_2a0;
  ulong local_298;
  Maybe<capnp::Schema> local_290;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_280;
  BrandedDecl local_278;
  StructBuilder local_1d0;
  StructBuilder local_1a8;
  PointerBuilder local_180;
  StructBuilder local_168;
  undefined1 local_140 [48];
  BrandScope *pBStack_110;
  word local_108;
  SegmentBuilder *pSStack_100;
  CapTableBuilder *local_f8;
  word *pwStack_f0;
  StructReader local_e8;
  StructReader local_b8 [2];
  ListBuilder local_58;
  
  local_2b8 = targetsFlagName.content.size_;
  local_2c0 = targetsFlagName.content.ptr;
  if ((annotations.reader.elementCount == 0) || (this->compileAnnotations == false)) {
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  }
  else {
    local_448 = __return_storage_ptr__;
    Orphanage::newOrphan<capnp::List<capnp::schema::Annotation,(capnp::Kind)3>>
              (__return_storage_ptr__,&this->orphanage,annotations.reader.elementCount);
    capnp::_::OrphanBuilder::asStructList
              (&local_58,&__return_storage_ptr__->builder,(StructSize)0x20001);
    __return_storage_ptr__ = local_448;
    if (annotations.reader.elementCount != 0) {
      local_2b0 = &local_278.source;
      local_2a8 = local_378;
      uVar20 = 0;
      local_2c8 = 0x28d1f8;
      local_2a0 = this;
      do {
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&local_2f8.value,&annotations.reader,(ElementCount)uVar20);
        local_298 = uVar20;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&local_320.value,&local_58,(ElementCount)uVar20);
        local_3f8 = local_320;
        aStack_3f0 = aStack_318;
        local_3e8 = local_308;
        capnp::_::PointerBuilder::initStruct
                  ((StructBuilder *)&local_280.value,(PointerBuilder *)&local_3f8.value,
                   (StructSize)0x10002);
        *(short *)local_278.body.field_1._0_8_ = 0;
        local_278.body._0_8_ = local_2f0;
        local_278.body.field_1._0_8_ = local_2e0;
        local_280 = local_2f8;
        uVar18 = local_2d0;
        if (local_2d4 == 0) {
          local_278.body._0_8_ = 0;
          local_278.body.field_1._0_8_ = (short *)0x0;
          local_280 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
          uVar18 = 0x7fffffff;
        }
        local_278.body.field_1._8_4_ = uVar18;
        capnp::_::PointerReader::getStruct(&local_428,(PointerReader *)&local_280.value,(word *)0x0)
        ;
        pWVar19 = (WirePointer *)0x0;
        DVar31.value = false;
        uVar37 = 0;
        aVar21 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
        implicitMethodParams.params.reader._44_4_ = uStack_474;
        implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
        implicitMethodParams.params.reader._39_1_ = uStack_479;
        implicitMethodParams.params.reader.structDataSize = 0;
        implicitMethodParams.params.reader.structPointerCount = 0;
        implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
        source._reader.capTable._0_4_ = (int)local_428.capTable;
        source._reader.segment = local_428.segment;
        source._reader.capTable._4_4_ = (int)((ulong)local_428.capTable >> 0x20);
        source._reader.data._0_4_ = (int)local_428.data;
        source._reader.data._4_4_ = (int)((ulong)local_428.data >> 0x20);
        source._reader.pointers._0_4_ = (int)local_428.pointers;
        source._reader.pointers._4_4_ = (int)((ulong)local_428.pointers >> 0x20);
        source._reader.dataSize = local_428.dataSize;
        source._reader.pointerCount = local_428.pointerCount;
        source._reader._38_2_ = local_428._38_2_;
        source._reader.nestingLimit = local_428.nestingLimit;
        source._reader._44_4_ = local_428._44_4_;
        auVar11 = ZEXT2440(ZEXT824(0));
        implicitMethodParams.scopeId = auVar11._0_8_;
        implicitMethodParams.params.reader.segment = (SegmentReader *)auVar11._8_8_;
        implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar11._16_8_;
        implicitMethodParams.params.reader.ptr = (byte *)auVar11._24_8_;
        implicitMethodParams.params.reader.elementCount = auVar11._32_4_;
        implicitMethodParams.params.reader.step = auVar11._36_4_;
        BrandScope::compileDeclExpression
                  ((Maybe<capnp::compiler::BrandedDecl> *)&local_3f8.value,(this->localBrand).ptr,
                   source,this->resolver,implicitMethodParams);
        local_280._0_1_ = local_3f8._0_1_;
        if (local_3f8._0_1_ == '\x01') {
          local_278.body.tag = aStack_3f0._0_4_;
          if (aStack_3f0._0_4_ == 2) {
            local_278.body.field_1._8_8_ = CONCAT44(uStack_3dc,uStack_3e0);
            local_278.body.field_1._0_8_ = local_3e8;
          }
          else if (aStack_3f0._0_4_ == 1) {
            local_278.body.field_1._32_8_ = local_3c8;
            local_278.body.field_1._8_8_ = CONCAT44(uStack_3dc,uStack_3e0);
            local_278.body.field_1._0_8_ = local_3e8;
            local_278.body.field_1.space[0x28] = local_3c0;
            if (local_3c0 == '\x01') {
              local_278.body.field_1._80_8_ = local_398;
              local_278.body.field_1._88_8_ = uStack_390;
              local_278.body.field_1._64_8_ = local_3a8;
              local_278.body.field_1._72_8_ = uStack_3a0;
              local_278.body.field_1._48_8_ = local_3b8;
              local_278.body.field_1._56_8_ = uStack_3b0;
              local_3c0 = '\0';
            }
          }
          uVar18 = *local_2a8;
          uVar32 = local_2a8[1];
          uVar33 = local_2a8[2];
          uVar34 = local_2a8[3];
          uVar5 = local_2a8[4];
          uVar6 = local_2a8[5];
          uVar7 = local_2a8[6];
          uVar8 = local_2a8[7];
          uVar9 = local_2a8[9];
          iVar36 = local_2a8[10];
          uVar10 = local_2a8[0xb];
          (local_2b0->_reader).dataSize = local_2a8[8];
          *(undefined4 *)&(local_2b0->_reader).pointerCount = uVar9;
          (local_2b0->_reader).nestingLimit = iVar36;
          *(undefined4 *)&(local_2b0->_reader).field_0x2c = uVar10;
          *(undefined4 *)&(local_2b0->_reader).data = uVar5;
          *(undefined4 *)((long)&(local_2b0->_reader).data + 4) = uVar6;
          *(undefined4 *)&(local_2b0->_reader).pointers = uVar7;
          *(undefined4 *)((long)&(local_2b0->_reader).pointers + 4) = uVar8;
          *(undefined4 *)&(local_2b0->_reader).segment = uVar18;
          *(undefined4 *)((long)&(local_2b0->_reader).segment + 4) = uVar32;
          *(undefined4 *)&(local_2b0->_reader).capTable = uVar33;
          *(undefined4 *)((long)&(local_2b0->_reader).capTable + 4) = uVar34;
          local_278.brand.ptr = pBStack_380;
          local_278.brand.disposer = local_388;
          pBStack_380 = (BrandScope *)0x0;
          if (aStack_3f0._0_4_ == 1) {
            aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                         ((ulong)aStack_3f0 & 0xffffffff00000000);
          }
          if (aStack_3f0._0_4_ == 2) {
            aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                         ((ulong)aStack_3f0 & 0xffffffff00000000);
          }
        }
        if (local_3f8._0_1_ == '\x01') {
          BrandedDecl::getKind(&local_278);
          iVar36 = local_428.nestingLimit;
          uVar33 = SUB84(local_428.data,0);
          uVar34 = SUB84(local_428.pointers,0);
          uVar18 = SUB84(local_428.segment,0);
          uVar32 = SUB84(local_428.capTable,0);
          if (local_3f8._0_1_ == '\x01') {
            if (local_3f8._2_2_ == 0xb) {
              DVar31.value = local_278.body.tag == 1;
              if (!DVar31.value) {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                          ((Fault *)&local_3f8.value,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                           ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                           (DebugExpression<bool> *)&stack0xfffffffffffffb58);
                kj::_::Debug::Fault::fatal((Fault *)&local_3f8.value);
              }
              local_468.builder.ptr = (BrandScope **)0x0;
              local_468.builder.pos = (BrandScope **)0x0;
              local_468.builder.endPtr = (BrandScope **)0x0;
              local_468.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
              local_430 = local_278.brand.ptr;
              pBVar22 = local_278.brand.ptr;
              do {
                if (((pBVar22->params).size_ != 0) ||
                   ((pBVar22->inherited == true && (pBVar22->leafParamCount != 0)))) {
                  if (local_468.builder.pos == local_468.builder.endPtr) {
                    sVar25 = (long)local_468.builder.endPtr - (long)local_468.builder.ptr >> 2;
                    if (local_468.builder.endPtr == local_468.builder.ptr) {
                      sVar25 = 4;
                    }
                    kj::Vector<capnp::compiler::BrandScope_*>::setCapacity(&local_468,sVar25);
                  }
                  *local_468.builder.pos = pBVar22;
                  local_468.builder.pos = local_468.builder.pos + 1;
                }
                pBVar22 = (pBVar22->parent).ptr.ptr;
              } while (pBVar22 != (BrandScope *)0x0);
              if (local_468.builder.pos != local_468.builder.ptr) {
                local_338 = local_308 + 4;
                local_348 = local_320;
                aStack_340 = aStack_318;
                capnp::_::PointerBuilder::initStruct
                          ((StructBuilder *)&stack0xfffffffffffffb58,
                           (PointerBuilder *)&local_348.value,(StructSize)0x10000);
                local_348._1_7_ = uVar37;
                local_348._0_1_ = DVar31.value;
                local_338 = (short *)0x0;
                aStack_340 = aVar21;
                capnp::_::PointerBuilder::initStructList
                          ((ListBuilder *)&local_3f8.value,(PointerBuilder *)&local_348.value,
                           (ElementCount)
                           ((ulong)((long)local_468.builder.pos - (long)local_468.builder.ptr) >> 3)
                           ,(StructSize)0x10002);
                if ((long)local_468.builder.pos - (long)local_468.builder.ptr != 0) {
                  aVar23 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                           ((long)local_468.builder.pos - (long)local_468.builder.ptr >> 3);
                  aVar30 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                  local_440 = aVar23;
                  do {
                    capnp::_::ListBuilder::getStructElement
                              ((StructBuilder *)&stack0xfffffffffffffb58,
                               (ListBuilder *)&local_3f8.value,aVar30._0_4_);
                    uVar20 = (ulong)aVar30 & 0xffffffff;
                    pBVar22 = local_468.builder.ptr[uVar20];
                    uVar18 = *(undefined4 *)((long)&pBVar22->leafId + 4);
                    pWVar19->offsetAndKind = (WireValue<uint32_t>)*(undefined4 *)&pBVar22->leafId;
                    pWVar19->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)uVar18;
                    local_438 = aVar30;
                    if (pBVar22->inherited == true) {
                      *(undefined2 *)&pWVar19[1].offsetAndKind.value = 1;
                    }
                    else {
                      sVar25 = (local_468.builder.ptr[uVar20]->params).size_;
                      *(undefined2 *)&pWVar19[1].offsetAndKind.value = 0;
                      local_1d0.segment = (SegmentBuilder *)CONCAT71(uVar37,DVar31.value);
                      local_1d0.data = (undefined2 *)0x0;
                      local_1d0.capTable = (CapTableBuilder *)aVar21;
                      capnp::_::PointerBuilder::initStructList
                                ((ListBuilder *)&local_348.value,(PointerBuilder *)&local_1d0,
                                 (ElementCount)sVar25,(StructSize)0x10001);
                      uVar26 = (ulong)local_330;
                      aVar23 = local_440;
                      this = local_2a0;
                      if (uVar26 != 0) {
                        lVar28 = 0;
                        uVar24 = 0;
                        do {
                          pBVar1 = (local_468.builder.ptr[uVar20]->params).ptr;
                          pEVar4 = local_430->errorReporter;
                          capnp::_::ListBuilder::getStructElement
                                    (&local_1d0,(ListBuilder *)&local_348.value,(ElementCount)uVar24
                                    );
                          *(undefined2 *)local_1d0.data = 1;
                          local_180.segment = local_1d0.segment;
                          local_180.capTable = local_1d0.capTable;
                          local_180.pointer = local_1d0.pointers;
                          capnp::_::PointerBuilder::initStruct
                                    (&local_1a8,&local_180,(StructSize)0x10003);
                          target._builder.segment._4_4_ =
                               (int)((uint7)local_1a8.segment._1_7_ >> 0x18);
                          target._builder.segment._0_4_ =
                               (int)CONCAT71(local_1a8.segment._1_7_,(char)local_1a8.segment);
                          target._builder.capTable._0_4_ = (int)local_1a8.capTable;
                          target._builder.capTable._4_4_ = (int)((ulong)local_1a8.capTable >> 0x20);
                          target._builder.data._0_4_ = (int)local_1a8.data;
                          target._builder.data._4_4_ = (int)((ulong)local_1a8.data >> 0x20);
                          target._builder.pointers._0_4_ = (int)local_1a8.pointers;
                          target._builder.pointers._4_4_ = (int)((ulong)local_1a8.pointers >> 0x20);
                          target._builder.dataSize = local_1a8.dataSize;
                          target._builder._36_4_ = local_1a8._36_4_;
                          BrandedDecl::compileAsType
                                    ((BrandedDecl *)((long)&(pBVar1->body).tag + lVar28),pEVar4,
                                     target);
                          uVar24 = uVar24 + 1;
                          lVar28 = lVar28 + 0xa8;
                          aVar23 = local_440;
                          this = local_2a0;
                        } while (uVar26 != uVar24);
                      }
                    }
                    aVar30 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                             ((long)local_438 + 1);
                  } while (aVar30 != aVar23);
                }
              }
              ppBVar14 = local_468.builder.endPtr;
              ppBVar13 = local_468.builder.pos;
              ppBVar12 = local_468.builder.ptr;
              if (local_468.builder.ptr != (BrandScope **)0x0) {
                local_468.builder.ptr = (BrandScope **)0x0;
                local_468.builder.pos = (BrandScope **)0x0;
                local_468.builder.endPtr = (BrandScope **)0x0;
                in_R8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                        ((long)ppBVar14 - (long)ppBVar12 >> 3);
                (**(local_468.builder.disposer)->_vptr_ArrayDisposer)
                          (local_468.builder.disposer,ppBVar12,8,
                           (long)ppBVar13 - (long)ppBVar12 >> 3);
              }
              *local_310 = local_278.body.field_1._0_8_;
              pRVar2 = this->resolver;
              uVar3 = *local_310;
              capnp::_::PointerBuilder::getStruct
                        ((StructBuilder *)&local_3f8.value,
                         (PointerBuilder *)&stack0xfffffffffffffb58,(StructSize)0x10000,(word *)0x0)
              ;
              capnp::_::StructBuilder::asReader((StructBuilder *)&local_3f8.value);
              (*pRVar2->_vptr_Resolver[6])(&local_1a8,pRVar2,uVar3);
              local_348._0_1_ = (char)local_1a8.segment;
              if ((char)local_1a8.segment == '\x01') {
                aStack_340 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                             local_1a8.capTable;
                Schema::getProto((Reader *)&local_3f8.value,&aStack_340.value);
                uVar15 = uStack_3d4;
                lVar28 = CONCAT44(uStack_3dc,uStack_3e0);
                local_440 = local_3f8;
                local_438 = aStack_3f0;
                uStack_479 = (undefined1)((ushort)uStack_3d2 >> 8);
                local_430 = (BrandScope *)CONCAT44(local_430._4_4_,uStack_3d0);
                uStack_474 = uStack_3cc;
                DVar31.value = SUB81(local_2c8,0);
                uVar37 = (undefined7)((ulong)local_2c8 >> 8);
                name_04.content.size_ = local_2b8;
                name_04.content.ptr = local_2c0;
                in_R8 = aStack_3f0;
                aVar21 = local_3f8;
                aVar23 = aStack_3f0;
                DynamicStruct::Reader::get
                          ((Reader *)&local_3f8.value,(Reader *)&stack0xfffffffffffffb58,name_04);
                RVar16 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply
                                   ((Reader *)&local_3f8.value);
                DynamicValue::Reader::~Reader((Reader *)&local_3f8.value);
                if (!RVar16) {
                  pEVar4 = this->errorReporter;
                  name_00._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb48;
                  name_00._reader.segment = (SegmentReader *)in_stack_fffffffffffffb40;
                  name_00._reader.data = (void *)in_stack_fffffffffffffb50;
                  name_00._reader.pointers._0_1_ = DVar31.value;
                  name_00._reader.pointers._1_7_ = uVar37;
                  name_00._reader._32_8_ = aVar21;
                  name_00._reader._40_8_ = aVar23;
                  expressionString(name_00);
                  kj::str<char_const(&)[2],kj::String,char_const(&)[49]>
                            ((String *)&local_3f8.value,(kj *)0x2223ec,
                             (char (*) [2])&stack0xfffffffffffffb58,
                             (String *)"\' cannot be applied to this kind of declaration.",
                             (char (*) [49])in_R8);
                  in_R8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                          ((long)aStack_3f0 +
                          (ulong)(aStack_3f0 ==
                                 (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0));
                  uVar20 = 0;
                  uVar26 = 0;
                  if (0x3f < local_428.dataSize) {
                    uVar26 = (ulong)*(uint *)((long)local_428.data + 4);
                  }
                  if (0x9f < local_428.dataSize) {
                    uVar20 = (ulong)*(uint *)((long)local_428.data + 0x10);
                  }
                  (**pEVar4->_vptr_ErrorReporter)(pEVar4,uVar26,uVar20);
                  aVar27 = aStack_3f0;
                  aVar30 = local_3f8;
                  if (local_3f8 != (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0)
                  {
                    local_3f8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                    aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                    (*(code *)**(undefined8 **)local_3e8)(local_3e8,aVar30,1);
                    in_R8 = aVar27;
                  }
                  if (CONCAT71(uVar37,DVar31.value) != 0) {
                    (*(code *)**(undefined8 **)aVar23)(aVar23,CONCAT71(uVar37,DVar31.value),1);
                    in_R8 = aVar21;
                  }
                }
                if (local_2d8 < 0x10) {
                  sVar17 = 0;
                }
                else {
                  sVar17 = *local_2e8;
                }
                if (sVar17 == 0) {
                  if (uVar15 < 4) {
                    aVar21 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                    pWVar19 = (WirePointer *)0x0;
                    aVar23 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                  }
                  else {
                    pWVar19 = (WirePointer *)(lVar28 + 0x18);
                    aVar21 = local_438;
                    aVar23 = local_440;
                  }
                  DVar31.value = aVar23._0_1_;
                  uVar37 = aVar23._1_7_;
                  capnp::_::PointerReader::getStruct
                            ((StructReader *)&local_3f8.value,
                             (PointerReader *)&stack0xfffffffffffffb58,(word *)0x0);
                  if ((local_3d8 < 0x10) || (*local_3e8 == 0)) {
                    capnp::_::PointerBuilder::getStruct
                              ((StructBuilder *)&local_3f8.value,
                               (PointerBuilder *)&stack0xfffffffffffffb58,(StructSize)0x10002,
                               (word *)0x0);
                    *local_3e8 = 0;
                  }
                  else {
                    pEVar4 = this->errorReporter;
                    name_03._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb48;
                    name_03._reader.segment = (SegmentReader *)in_stack_fffffffffffffb40;
                    name_03._reader.data = (void *)in_stack_fffffffffffffb50;
                    name_03._reader.pointers._0_1_ = DVar31.value;
                    name_03._reader.pointers._1_7_ = uVar37;
                    name_03._reader._32_8_ = aVar21;
                    name_03._reader._40_8_ = pWVar19;
                    expressionString(name_03);
                    kj::str<char_const(&)[2],kj::String,char_const(&)[20]>
                              ((String *)&local_3f8.value,(kj *)0x2223ec,
                               (char (*) [2])&stack0xfffffffffffffb58,
                               (String *)"\' requires a value.",(char (*) [20])in_R8);
                    in_R8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                            ((long)aStack_3f0 +
                            (ulong)(aStack_3f0 ==
                                   (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0))
                    ;
                    uVar20 = 0;
                    uVar26 = 0;
                    if (0x3f < local_428.dataSize) {
                      uVar26 = (ulong)*(uint *)((long)local_428.data + 4);
                    }
                    if (0x9f < local_428.dataSize) {
                      uVar20 = (ulong)*(uint *)((long)local_428.data + 0x10);
                    }
                    (**pEVar4->_vptr_ErrorReporter)(pEVar4,uVar26,uVar20);
                    aVar30 = aStack_3f0;
                    aVar23 = local_3f8;
                    if (local_3f8 != (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0
                       ) {
                      local_3f8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                      aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                      (*(code *)**(undefined8 **)local_3e8)(local_3e8,aVar23,1);
                      in_R8 = aVar30;
                    }
                    if (CONCAT71(uVar37,DVar31.value) != 0) {
                      (**(code **)*pWVar19)(pWVar19,CONCAT71(uVar37,DVar31.value),1);
                      in_R8 = aVar21;
                    }
                    if (uVar15 < 4) {
                      uStack_3e0 = 0x7fffffff;
                      aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                      local_3e8 = (short *)0x0;
                      local_3f8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                    }
                    else {
                      local_3e8 = (short *)(lVar28 + 0x18);
                      aStack_3f0 = local_438;
                      local_3f8 = local_440;
                      uStack_3e0 = local_430._0_4_;
                    }
                    capnp::_::PointerReader::getStruct
                              (local_b8,(PointerReader *)&local_3f8.value,(word *)0x0);
                    local_3f8 = local_320;
                    aStack_3f0 = aStack_318;
                    local_3e8 = local_308;
                    this_00 = (NodeTranslator *)local_140;
                    capnp::_::PointerBuilder::getStruct
                              ((StructBuilder *)this_00,(PointerBuilder *)&local_3f8.value,
                               (StructSize)0x10002,(word *)0x0);
                    type._reader.capTable._0_4_ = (int)local_b8[0].capTable;
                    type._reader.segment = local_b8[0].segment;
                    type._reader.capTable._4_4_ = (int)((ulong)local_b8[0].capTable >> 0x20);
                    type._reader.data._0_4_ = (int)local_b8[0].data;
                    type._reader.data._4_4_ = (int)((ulong)local_b8[0].data >> 0x20);
                    type._reader.pointers._0_4_ = (int)local_b8[0].pointers;
                    type._reader.pointers._4_4_ = (int)((ulong)local_b8[0].pointers >> 0x20);
                    type._reader.dataSize = (StructDataBitCount)local_b8[0]._32_8_;
                    type._reader._36_4_ = SUB84(local_b8[0]._32_8_,4);
                    type._reader.nestingLimit = (int)local_b8[0]._40_8_;
                    type._reader._44_4_ = SUB84(local_b8[0]._40_8_,4);
                    target_00._builder.capTable = (CapTableBuilder *)local_140._8_8_;
                    target_00._builder.segment = (SegmentBuilder *)local_140._0_8_;
                    target_00._builder.data = (void *)local_140._16_8_;
                    target_00._builder.pointers = (WirePointer *)local_140._24_8_;
                    target_00._builder.dataSize = local_140._32_4_;
                    target_00._builder.pointerCount = local_140._36_2_;
                    target_00._builder._38_2_ = local_140._38_2_;
                    compileDefaultDefaultValue(this_00,type,target_00);
                  }
                }
                else if (sVar17 == 1) {
                  if (local_2d4 < 2) {
                    uStack_3e0 = 0x7fffffff;
                    aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                    local_3e8 = (short *)0x0;
                    local_3f8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                  }
                  else {
                    local_3e8 = local_2e0 + 4;
                    aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                                 local_2f0;
                    local_3f8 = local_2f8;
                    uStack_3e0 = local_2d0;
                  }
                  capnp::_::PointerReader::getStruct
                            (&local_e8,(PointerReader *)&local_3f8.value,(word *)0x0);
                  if (uVar15 < 4) {
                    uStack_3e0 = 0x7fffffff;
                    aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                    local_3e8 = (short *)0x0;
                    local_3f8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                  }
                  else {
                    local_3e8 = (short *)(lVar28 + 0x18);
                    aStack_3f0 = local_438;
                    local_3f8 = local_440;
                    uStack_3e0 = local_430._0_4_;
                  }
                  capnp::_::PointerReader::getStruct
                            ((StructReader *)(local_140 + 0x28),(PointerReader *)&local_3f8.value,
                             (word *)0x0);
                  local_3f8 = local_320;
                  aStack_3f0 = aStack_318;
                  local_3e8 = local_308;
                  capnp::_::PointerBuilder::getStruct
                            (&local_168,(PointerBuilder *)&local_3f8.value,(StructSize)0x10002,
                             (word *)0x0);
                  local_290.ptr.isSet = true;
                  local_290.ptr.field_1 = aStack_340;
                  source_00._reader.capTable._0_4_ = (int)local_e8.capTable;
                  source_00._reader.segment = local_e8.segment;
                  source_00._reader.capTable._4_4_ = (int)((ulong)local_e8.capTable >> 0x20);
                  source_00._reader.data._0_4_ = (int)local_e8.data;
                  source_00._reader.data._4_4_ = (int)((ulong)local_e8.data >> 0x20);
                  source_00._reader.pointers._0_4_ = (int)local_e8.pointers;
                  source_00._reader.pointers._4_4_ = (int)((ulong)local_e8.pointers >> 0x20);
                  source_00._reader.dataSize = local_e8.dataSize;
                  source_00._reader._36_4_ = local_e8._36_4_;
                  source_00._reader.nestingLimit = local_e8.nestingLimit;
                  source_00._reader._44_4_ = local_e8._44_4_;
                  type_00._reader.capTable = (CapTableReader *)pBStack_110;
                  type_00._reader.segment = (SegmentReader *)local_140._40_8_;
                  type_00._reader.data = (void *)local_108.content;
                  type_00._reader.pointers = (WirePointer *)pSStack_100;
                  type_00._reader._32_8_ = local_f8;
                  type_00._reader._40_8_ = pwStack_f0;
                  target_01._builder.capTable = local_168.capTable;
                  target_01._builder.segment = local_168.segment;
                  target_01._builder.data = local_168.data;
                  target_01._builder.pointers = local_168.pointers;
                  target_01._builder.dataSize = local_168.dataSize;
                  target_01._builder.pointerCount = local_168.pointerCount;
                  target_01._builder._38_2_ = local_168._38_2_;
                  in_stack_fffffffffffffb40 = local_168.pointers;
                  in_stack_fffffffffffffb48 = local_168._32_8_;
                  compileBootstrapValue(this,source_00,type_00,target_01,&local_290);
                }
              }
            }
            else {
              pEVar4 = this->errorReporter;
              name_02._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb48;
              name_02._reader.segment = (SegmentReader *)in_stack_fffffffffffffb40;
              name_02._reader.data = (void *)in_stack_fffffffffffffb50;
              name_02._reader.pointers._0_1_ = DVar31.value;
              name_02._reader.pointers._1_7_ = uVar37;
              name_02._reader._32_8_ = aVar21;
              name_02._reader._40_8_ = pWVar19;
              expressionString(name_02);
              kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                        ((String *)&local_3f8.value,(kj *)0x2223ec,
                         (char (*) [2])&stack0xfffffffffffffb58,(String *)"\' is not an annotation."
                         ,(char (*) [24])in_R8);
              in_R8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                      ((long)aStack_3f0 +
                      (ulong)(aStack_3f0 ==
                             (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0));
              uVar20 = 0;
              uVar26 = 0;
              if (0x3f < local_428.dataSize) {
                uVar26 = (ulong)*(uint *)((long)local_428.data + 4);
              }
              if (0x9f < local_428.dataSize) {
                uVar20 = (ulong)*(uint *)((long)local_428.data + 0x10);
              }
              (**pEVar4->_vptr_ErrorReporter)(pEVar4,uVar26,uVar20);
              aVar30 = aStack_3f0;
              aVar23 = local_3f8;
              if (local_3f8 != (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0) {
                local_3f8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                (*(code *)**(undefined8 **)local_3e8)(local_3e8,aVar23,1);
                in_R8 = aVar30;
              }
              if (CONCAT71(uVar37,DVar31.value) != 0) {
                (**(code **)*pWVar19)(pWVar19,CONCAT71(uVar37,DVar31.value),1);
                in_R8 = aVar21;
              }
            }
          }
          else {
            pEVar4 = this->errorReporter;
            name_01._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb48;
            name_01._reader.segment = (SegmentReader *)in_stack_fffffffffffffb40;
            name_01._reader.data = (void *)in_stack_fffffffffffffb50;
            name_01._reader.pointers._0_1_ = DVar31.value;
            name_01._reader.pointers._1_7_ = uVar37;
            name_01._reader._32_8_ = aVar21;
            name_01._reader._40_8_ = pWVar19;
            SVar35 = local_428.dataSize;
            expressionString(name_01);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)&local_3f8.value,(kj *)0x2223ec,
                       (char (*) [2])&stack0xfffffffffffffb58,(String *)"\' is not an annotation.",
                       (char (*) [24])in_R8);
            in_R8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                    ((long)aStack_3f0 +
                    (ulong)(aStack_3f0 ==
                           (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0));
            uVar20 = 0;
            uVar26 = 0;
            if (0x3f < local_428.dataSize) {
              uVar26 = (ulong)*(uint *)((long)local_428.data + 4);
            }
            if (0x9f < local_428.dataSize) {
              uVar20 = (ulong)*(uint *)((long)local_428.data + 0x10);
            }
            (**pEVar4->_vptr_ErrorReporter)(pEVar4,uVar26,uVar20);
            aVar30 = aStack_3f0;
            aVar23 = local_3f8;
            if (local_3f8 != (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0) {
              local_3f8 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
              aStack_3f0 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
              (*(code *)**(undefined8 **)local_3e8)
                        (local_3e8,aVar23,1,aVar30,aVar30,0,uVar18,uVar32,uVar33,uVar34,SVar35,
                         iVar36);
              in_R8 = aVar30;
            }
            if (CONCAT71(uVar37,DVar31.value) != 0) {
              (**(code **)*pWVar19)(pWVar19,CONCAT71(uVar37,DVar31.value),1);
              in_R8 = aVar21;
            }
          }
        }
        pBVar22 = local_278.brand.ptr;
        if (local_280._0_1_ == '\x01') {
          if (local_278.brand.ptr != (BrandScope *)0x0) {
            local_278.brand.ptr = (BrandScope *)0x0;
            (**(local_278.brand.disposer)->_vptr_Disposer)
                      (local_278.brand.disposer,
                       (_func_int *)
                       ((long)&(pBVar22->super_Refcounted).super_Disposer._vptr_Disposer +
                       (long)(pBVar22->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
          }
          if (local_278.body.tag == 1) {
            local_278.body._0_8_ = local_278.body._0_8_ & 0xffffffff00000000;
          }
          if (local_278.body.tag == 2) {
            local_278.body._0_8_ = local_278.body._0_8_ & 0xffffffff00000000;
          }
        }
        uVar29 = (int)local_298 + 1;
        uVar20 = (ulong)uVar29;
        __return_storage_ptr__ = local_448;
      } while (uVar29 < annotations.reader.elementCount);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Annotation>> NodeTranslator::compileAnnotationApplications(
    List<Declaration::AnnotationApplication>::Reader annotations,
    kj::StringPtr targetsFlagName) {
  if (annotations.size() == 0 || !compileAnnotations) {
    // Return null.
    return Orphan<List<schema::Annotation>>();
  }

  auto result = orphanage.newOrphan<List<schema::Annotation>>(annotations.size());
  auto builder = result.get();

  for (uint i = 0; i < annotations.size(); i++) {
    Declaration::AnnotationApplication::Reader annotation = annotations[i];
    schema::Annotation::Builder annotationBuilder = builder[i];

    // Set the annotation's value to void in case we fail to produce something better below.
    annotationBuilder.initValue().setVoid();

    auto name = annotation.getName();
    KJ_IF_SOME(decl, compileDeclExpression(name, ImplicitParams::none())) {
      KJ_IF_SOME(kind, decl.getKind()) {
        if (kind != Declaration::ANNOTATION) {
          errorReporter.addErrorOn(name, kj::str(
              "'", expressionString(name), "' is not an annotation."));
        } else {
          annotationBuilder.setId(decl.getIdAndFillBrand(
              [&]() { return annotationBuilder.initBrand(); }));
          KJ_IF_SOME(annotationSchema,
                      resolver.resolveBootstrapSchema(annotationBuilder.getId(),
                                                      annotationBuilder.getBrand())) {
            auto node = annotationSchema.getProto().getAnnotation();
            if (!toDynamic(node).get(targetsFlagName).as<bool>()) {
              errorReporter.addErrorOn(name, kj::str(
                  "'", expressionString(name), "' cannot be applied to this kind of declaration."));
            }

            // Interpret the value.
            auto value = annotation.getValue();
            switch (value.which()) {
              case Declaration::AnnotationApplication::Value::NONE:
                // No value, i.e. void.
                if (node.getType().isVoid()) {
                  annotationBuilder.getValue().setVoid();
                } else {
                  errorReporter.addErrorOn(name, kj::str(
                      "'", expressionString(name), "' requires a value."));
                  compileDefaultDefaultValue(node.getType(), annotationBuilder.getValue());
                }
                break;

              case Declaration::AnnotationApplication::Value::EXPRESSION:
                compileBootstrapValue(value.getExpression(), node.getType(),
                                      annotationBuilder.getValue(),
                                      annotationSchema);
                break;
            }
          }
        }
      } else {
        errorReporter.addErrorOn(name, kj::str(
            "'", expressionString(name), "' is not an annotation."));
      }
    }
  }